

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O3

CURL_conflict * curl_easy_init(void)

{
  CURLcode CVar1;
  CURL_conflict *in_RAX;
  _Bool in_SIL;
  Curl_easy *data;
  CURL_conflict *local_8;
  
  local_8 = in_RAX;
  if (((initialized == 0) && (CVar1 = global_init(1,in_SIL), CVar1 != CURLE_OK)) ||
     (CVar1 = Curl_open(&local_8), CVar1 != CURLE_OK)) {
    local_8 = (CURL_conflict *)0x0;
  }
  return local_8;
}

Assistant:

struct Curl_easy *curl_easy_init(void)
{
  CURLcode result;
  struct Curl_easy *data;

  /* Make sure we inited the global SSL stuff */
  global_init_lock();

  if(!initialized) {
    result = global_init(CURL_GLOBAL_DEFAULT, TRUE);
    if(result) {
      /* something in the global init failed, return nothing */
      DEBUGF(fprintf(stderr, "Error: curl_global_init failed\n"));
      global_init_unlock();
      return NULL;
    }
  }
  global_init_unlock();

  /* We use curl_open() with undefined URL so far */
  result = Curl_open(&data);
  if(result) {
    DEBUGF(fprintf(stderr, "Error: Curl_open failed\n"));
    return NULL;
  }

  return data;
}